

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O1

void P_TranslatePortalXY(line_t_conflict *src,double *x,double *y)

{
  FLinePortal *port;
  double dVar1;
  double dVar2;
  double dVar3;
  vertex_t *pvVar4;
  double dVar5;
  double dVar6;
  
  if ((src != (line_t_conflict *)0x0) &&
     (linePortals.Array != (FLinePortal *)0x0 && src->portalindex < linePortals.Count)) {
    port = linePortals.Array + src->portalindex;
    if ((port->mFlags & 0x10) != 0) {
      SetRotation(port);
    }
    dVar5 = *x - (src->v1->p).X;
    dVar6 = *y - (src->v1->p).Y;
    dVar1 = port->mCosRot;
    dVar2 = port->mSinRot;
    pvVar4 = port->mDestination->v2;
    dVar3 = (pvVar4->p).Y;
    *x = (dVar5 * dVar1 - dVar6 * dVar2) + (pvVar4->p).X;
    *y = dVar5 * dVar2 + dVar6 * dVar1 + dVar3;
  }
  return;
}

Assistant:

void P_TranslatePortalXY(line_t* src, double& x, double& y)
{
	if (!src) return;
	FLinePortal *port = src->getPortal();
	if (!port) return;
	if (port->mFlags & PORTF_POLYOBJ) SetRotation(port);	// update the angle for polyportals.

	// offsets from line
	double nposx = x - src->v1->fX();
	double nposy = y - src->v1->fY();

	// Rotate position along normal to match exit linedef
	double tx = nposx * port->mCosRot - nposy * port->mSinRot;
	double ty = nposy * port->mCosRot + nposx * port->mSinRot;

	tx += port->mDestination->v2->fX();
	ty += port->mDestination->v2->fY();

	x = tx;
	y = ty;
}